

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O2

PClassActor * __thiscall PClassActor::GetReplacement(PClassActor *this,bool lookskill)

{
  PClass *pPVar1;
  PClassActor *pPVar2;
  undefined7 in_register_00000031;
  FName FVar3;
  PClassActor *pPVar4;
  FName local_50;
  FName local_4c;
  FName local_48;
  FName local_44;
  FName local_40;
  FName local_3c;
  int local_38;
  FName local_34;
  
  FVar3.Index = 0;
  if (((int)CONCAT71(in_register_00000031,lookskill) != 0) &&
     (FVar3.Index = 0, (uint)gameskill.Value < AllSkills.Count)) {
    local_38 = (this->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.TypeName.
               Index;
    FSkillInfo::GetReplacement
              ((FSkillInfo *)&stack0xffffffffffffffcc,&AllSkills.Array[gameskill.Value].Name);
    if ((long)local_34.Index != 0) {
      local_3c.Index = local_34.Index;
      pPVar1 = PClass::FindClass(&local_3c);
      FVar3.Index = local_34.Index;
      if (pPVar1 == (PClass *)0x0) {
        Printf("Warning: incorrect actor name in definition of skill %s: \nclass %s is replaced by non-existent class %s\nSkill replacement will be ignored for this actor.\n"
               ,FName::NameData.NameArray[AllSkills.Array[gameskill.Value].Name.Index].Text,
               FName::NameData.NameArray
               [(this->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.TypeName.
                Index].Text,FName::NameData.NameArray[local_34.Index].Text);
        local_40.Index =
             (this->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.TypeName.Index;
        local_44.Index = 0;
        FSkillInfo::SetReplacement(AllSkills.Array + gameskill.Value,&local_40,&local_44);
        local_48.Index = local_34.Index;
        local_4c.Index = 0;
        FSkillInfo::SetReplacedBy(AllSkills.Array + gameskill.Value,&local_48,&local_4c);
        pPVar2 = this->Replacement;
        if (pPVar2 == (PClassActor *)0x0) {
          return this;
        }
        this->Replacement = (PClassActor *)0x0;
        pPVar4 = pPVar2;
        goto LAB_003b2e2a;
      }
    }
  }
  pPVar4 = this->Replacement;
  if (pPVar4 == (PClassActor *)0x0) {
    if (!lookskill || FVar3.Index == 0) {
      return this;
    }
    this->Replacement = (PClassActor *)0x0;
  }
  else {
    this->Replacement = (PClassActor *)0x0;
    pPVar2 = pPVar4;
    if (!lookskill || FVar3.Index == 0) goto LAB_003b2e2a;
  }
  local_50.Index = FVar3.Index;
  pPVar2 = PClass::FindActor(&local_50);
LAB_003b2e2a:
  pPVar2 = GetReplacement(pPVar2,false);
  this->Replacement = pPVar4;
  return pPVar2;
}

Assistant:

PClassActor *PClassActor::GetReplacement(bool lookskill)
{
	FName skillrepname;
	
	if (lookskill && AllSkills.Size() > (unsigned)gameskill)
	{
		skillrepname = AllSkills[gameskill].GetReplacement(TypeName);
		if (skillrepname != NAME_None && PClass::FindClass(skillrepname) == NULL)
		{
			Printf("Warning: incorrect actor name in definition of skill %s: \n"
				   "class %s is replaced by non-existent class %s\n"
				   "Skill replacement will be ignored for this actor.\n", 
				   AllSkills[gameskill].Name.GetChars(), 
				   TypeName.GetChars(), skillrepname.GetChars());
			AllSkills[gameskill].SetReplacement(TypeName, NAME_None);
			AllSkills[gameskill].SetReplacedBy(skillrepname, NAME_None);
			lookskill = false; skillrepname = NAME_None;
		}
	}
	if (Replacement == NULL && (!lookskill || skillrepname == NAME_None))
	{
		return this;
	}
	// The Replacement field is temporarily NULLed to prevent
	// potential infinite recursion.
	PClassActor *savedrep = Replacement;
	Replacement = NULL;
	PClassActor *rep = savedrep;
	// Handle skill-based replacement here. It has precedence on DECORATE replacement
	// in that the skill replacement is applied first, followed by DECORATE replacement
	// on the actor indicated by the skill replacement.
	if (lookskill && (skillrepname != NAME_None))
	{
		rep = PClass::FindActor(skillrepname);
	}
	// Now handle DECORATE replacement chain
	// Skill replacements are not recursive, contrarily to DECORATE replacements
	rep = rep->GetReplacement(false);
	// Reset the temporarily NULLed field
	Replacement = savedrep;
	return rep;
}